

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_CCtx_init_compressStream2(ZSTD_CCtx *cctx,ZSTD_EndDirective endOp,size_t inSize)

{
  ZSTD_compressionParameters cParams;
  uint uVar1;
  U64 pledgedSrcSize_00;
  size_t code;
  undefined8 in_stack_fffffffffffffe74;
  void *local_180;
  void *local_178;
  size_t err_code_1;
  U64 pledgedSrcSize;
  uint local_138;
  uint uStack_134;
  undefined8 local_130;
  ZSTD_strategy local_128;
  ZSTD_cParamMode_e local_124;
  void *pvStack_120;
  ZSTD_cParamMode_e mode;
  size_t dictSize;
  size_t err_code;
  ZSTD_prefixDict prefixDict;
  ZSTD_CCtx_params params;
  size_t inSize_local;
  ZSTD_EndDirective endOp_local;
  ZSTD_CCtx *cctx_local;
  
  memcpy(&prefixDict.dictContentType,&cctx->requestedParams,0xd0);
  err_code = (size_t)(cctx->prefixDict).dict;
  prefixDict.dict = (void *)(cctx->prefixDict).dictSize;
  prefixDict.dictSize = *(size_t *)&(cctx->prefixDict).dictContentType;
  dictSize = ZSTD_initLocalDict(cctx);
  uVar1 = ERR_isError(dictSize);
  if (uVar1 == 0) {
    memset(&cctx->prefixDict,0,0x18);
    if ((err_code != 0) && (cctx->cdict != (ZSTD_CDict *)0x0)) {
      __assert_fail("prefixDict.dict==NULL || cctx->cdict==NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x17df,
                    "size_t ZSTD_CCtx_init_compressStream2(ZSTD_CCtx *, ZSTD_EndDirective, size_t)")
      ;
    }
    if ((cctx->cdict != (ZSTD_CDict *)0x0) && ((cctx->localDict).cdict == (ZSTD_CDict *)0x0)) {
      params.fParams.checksumFlag = cctx->cdict->compressionLevel;
    }
    if (endOp == ZSTD_e_end) {
      cctx->pledgedSrcSizePlusOne = inSize + 1;
    }
    if (err_code == 0) {
      if (cctx->cdict == (ZSTD_CDict *)0x0) {
        local_180 = (void *)0x0;
      }
      else {
        local_180 = (void *)cctx->cdict->dictContentSize;
      }
      local_178 = local_180;
    }
    else {
      local_178 = prefixDict.dict;
    }
    pvStack_120 = local_178;
    local_124 = ZSTD_getCParamMode(cctx->cdict,(ZSTD_CCtx_params *)&prefixDict.dictContentType,
                                   cctx->pledgedSrcSizePlusOne - 1);
    ZSTD_getCParamsFromCCtxParams
              ((ZSTD_compressionParameters *)&pledgedSrcSize,
               (ZSTD_CCtx_params *)&prefixDict.dictContentType,cctx->pledgedSrcSizePlusOne - 1,
               (size_t)pvStack_120,local_124);
    stack0xffffffffffffff0c = pledgedSrcSize;
    ZSTD_resolveBlockSplitterMode
              (params.blockDelimiters,(ZSTD_compressionParameters *)&prefixDict.field_0x14);
    ZSTD_resolveEnableLdm(params.overlapLog,(ZSTD_compressionParameters *)&prefixDict.field_0x14);
    ZSTD_resolveRowMatchFinderMode
              (params.validateSequences,(ZSTD_compressionParameters *)&prefixDict.field_0x14);
    ZSTD_resolveExternalSequenceValidation(params.outBufferMode);
    ZSTD_resolveMaxBlockSize(params._184_8_);
    ZSTD_resolveExternalRepcodeSearch
              ((ZSTD_paramSwitch_e)params.maxBlockSize,params.fParams.checksumFlag);
    pledgedSrcSize_00 = cctx->pledgedSrcSizePlusOne - 1;
    cParams.hashLog = (uint)local_130;
    cParams.windowLog = local_138;
    cParams.chainLog = uStack_134;
    cParams.searchLog = SUB84(local_130,4);
    cParams.minMatch = local_128;
    cParams.targetLength = (int)in_stack_fffffffffffffe74;
    cParams.strategy = (int)((ulong)in_stack_fffffffffffffe74 >> 0x20);
    code = ZSTD_checkCParams(cParams);
    uVar1 = ERR_isError(code);
    if (uVar1 != 0) {
      __assert_fail("!ZSTD_isError(ZSTD_checkCParams(params.cParams))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x181f,
                    "size_t ZSTD_CCtx_init_compressStream2(ZSTD_CCtx *, ZSTD_EndDirective, size_t)")
      ;
    }
    cctx_local = (ZSTD_CCtx *)
                 ZSTD_compressBegin_internal
                           (cctx,(void *)err_code,(size_t)prefixDict.dict,
                            (ZSTD_dictContentType_e)prefixDict.dictSize,ZSTD_dtlm_fast,cctx->cdict,
                            (ZSTD_CCtx_params *)&prefixDict.dictContentType,pledgedSrcSize_00,
                            ZSTDb_buffered);
    uVar1 = ERR_isError((size_t)cctx_local);
    if (uVar1 == 0) {
      if ((cctx->appliedParams).nbWorkers != 0) {
        __assert_fail("cctx->appliedParams.nbWorkers == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                      ,0x1825,
                      "size_t ZSTD_CCtx_init_compressStream2(ZSTD_CCtx *, ZSTD_EndDirective, size_t)"
                     );
      }
      cctx->inToCompress = 0;
      cctx->inBuffPos = 0;
      if ((cctx->appliedParams).inBufferMode == ZSTD_bm_buffered) {
        cctx->inBuffTarget =
             cctx->blockSize + (long)(int)(uint)(cctx->blockSize == pledgedSrcSize_00);
      }
      else {
        cctx->inBuffTarget = 0;
      }
      cctx->outBuffFlushedSize = 0;
      cctx->outBuffContentSize = 0;
      cctx->streamStage = zcss_load;
      cctx->frameEnded = 0;
      cctx_local = (ZSTD_CCtx *)0x0;
    }
  }
  else {
    cctx_local = (ZSTD_CCtx *)dictSize;
  }
  return (size_t)cctx_local;
}

Assistant:

static size_t ZSTD_CCtx_init_compressStream2(ZSTD_CCtx* cctx,
                                             ZSTD_EndDirective endOp,
                                             size_t inSize)
{
    ZSTD_CCtx_params params = cctx->requestedParams;
    ZSTD_prefixDict const prefixDict = cctx->prefixDict;
    FORWARD_IF_ERROR( ZSTD_initLocalDict(cctx) , ""); /* Init the local dict if present. */
    ZSTD_memset(&cctx->prefixDict, 0, sizeof(cctx->prefixDict));   /* single usage */
    assert(prefixDict.dict==NULL || cctx->cdict==NULL);    /* only one can be set */
    if (cctx->cdict && !cctx->localDict.cdict) {
        /* Let the cdict's compression level take priority over the requested params.
         * But do not take the cdict's compression level if the "cdict" is actually a localDict
         * generated from ZSTD_initLocalDict().
         */
        params.compressionLevel = cctx->cdict->compressionLevel;
    }
    DEBUGLOG(4, "ZSTD_compressStream2 : transparent init stage");
    if (endOp == ZSTD_e_end) cctx->pledgedSrcSizePlusOne = inSize + 1;  /* auto-determine pledgedSrcSize */

    {   size_t const dictSize = prefixDict.dict
                ? prefixDict.dictSize
                : (cctx->cdict ? cctx->cdict->dictContentSize : 0);
        ZSTD_cParamMode_e const mode = ZSTD_getCParamMode(cctx->cdict, &params, cctx->pledgedSrcSizePlusOne - 1);
        params.cParams = ZSTD_getCParamsFromCCtxParams(
                &params, cctx->pledgedSrcSizePlusOne-1,
                dictSize, mode);
    }

    params.useBlockSplitter = ZSTD_resolveBlockSplitterMode(params.useBlockSplitter, &params.cParams);
    params.ldmParams.enableLdm = ZSTD_resolveEnableLdm(params.ldmParams.enableLdm, &params.cParams);
    params.useRowMatchFinder = ZSTD_resolveRowMatchFinderMode(params.useRowMatchFinder, &params.cParams);
    params.validateSequences = ZSTD_resolveExternalSequenceValidation(params.validateSequences);
    params.maxBlockSize = ZSTD_resolveMaxBlockSize(params.maxBlockSize);
    params.searchForExternalRepcodes = ZSTD_resolveExternalRepcodeSearch(params.searchForExternalRepcodes, params.compressionLevel);

#ifdef ZSTD_MULTITHREAD
    /* If external matchfinder is enabled, make sure to fail before checking job size (for consistency) */
    RETURN_ERROR_IF(
        params.useSequenceProducer == 1 && params.nbWorkers >= 1,
        parameter_combination_unsupported,
        "External sequence producer isn't supported with nbWorkers >= 1"
    );

    if ((cctx->pledgedSrcSizePlusOne-1) <= ZSTDMT_JOBSIZE_MIN) {
        params.nbWorkers = 0; /* do not invoke multi-threading when src size is too small */
    }
    if (params.nbWorkers > 0) {
#if ZSTD_TRACE
        cctx->traceCtx = (ZSTD_trace_compress_begin != NULL) ? ZSTD_trace_compress_begin(cctx) : 0;
#endif
        /* mt context creation */
        if (cctx->mtctx == NULL) {
            DEBUGLOG(4, "ZSTD_compressStream2: creating new mtctx for nbWorkers=%u",
                        params.nbWorkers);
            cctx->mtctx = ZSTDMT_createCCtx_advanced((U32)params.nbWorkers, cctx->customMem, cctx->pool);
            RETURN_ERROR_IF(cctx->mtctx == NULL, memory_allocation, "NULL pointer!");
        }
        /* mt compression */
        DEBUGLOG(4, "call ZSTDMT_initCStream_internal as nbWorkers=%u", params.nbWorkers);
        FORWARD_IF_ERROR( ZSTDMT_initCStream_internal(
                    cctx->mtctx,
                    prefixDict.dict, prefixDict.dictSize, prefixDict.dictContentType,
                    cctx->cdict, params, cctx->pledgedSrcSizePlusOne-1) , "");
        cctx->dictID = cctx->cdict ? cctx->cdict->dictID : 0;
        cctx->dictContentSize = cctx->cdict ? cctx->cdict->dictContentSize : prefixDict.dictSize;
        cctx->consumedSrcSize = 0;
        cctx->producedCSize = 0;
        cctx->streamStage = zcss_load;
        cctx->appliedParams = params;
    } else
#endif  /* ZSTD_MULTITHREAD */
    {   U64 const pledgedSrcSize = cctx->pledgedSrcSizePlusOne - 1;
        assert(!ZSTD_isError(ZSTD_checkCParams(params.cParams)));
        FORWARD_IF_ERROR( ZSTD_compressBegin_internal(cctx,
                prefixDict.dict, prefixDict.dictSize, prefixDict.dictContentType, ZSTD_dtlm_fast,
                cctx->cdict,
                &params, pledgedSrcSize,
                ZSTDb_buffered) , "");
        assert(cctx->appliedParams.nbWorkers == 0);
        cctx->inToCompress = 0;
        cctx->inBuffPos = 0;
        if (cctx->appliedParams.inBufferMode == ZSTD_bm_buffered) {
            /* for small input: avoid automatic flush on reaching end of block, since
            * it would require to add a 3-bytes null block to end frame
            */
            cctx->inBuffTarget = cctx->blockSize + (cctx->blockSize == pledgedSrcSize);
        } else {
            cctx->inBuffTarget = 0;
        }
        cctx->outBuffContentSize = cctx->outBuffFlushedSize = 0;
        cctx->streamStage = zcss_load;
        cctx->frameEnded = 0;
    }
    return 0;
}